

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete.cpp
# Opt level: O0

void __thiscall setup::delete_entry::load(delete_entry *this,istream *is,info *i)

{
  uint uVar1;
  enum_type eVar2;
  int_adapter<unsigned_int> *in_RDX;
  istream *in_RSI;
  istream *in_RDI;
  info *in_stack_00000080;
  istream *in_stack_00000088;
  item *in_stack_00000090;
  stored_enum<setup::(anonymous_namespace)::delete_target_type_map> *in_stack_00000168;
  encoded_string local_30;
  int_adapter<unsigned_int> *local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar1 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar1 < 0x1030000) {
    util::load<unsigned_int>((istream *)0x16de58);
  }
  util::encoded_string::encoded_string
            (&local_30,(string *)&in_RDI->field_0x100,local_18[6].value_,
             (bitset<256UL> *)(local_18 + 0x138));
  util::operator>>(in_RDI,(encoded_string *)local_10);
  item::load_condition_data(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  item::load_version_data((item *)in_RDI,local_10,(version *)0x16dec5);
  stored_enum<setup::(anonymous_namespace)::delete_target_type_map>::stored_enum
            ((stored_enum<setup::(anonymous_namespace)::delete_target_type_map> *)in_RDI,local_10);
  eVar2 = stored_enum<setup::(anonymous_namespace)::delete_target_type_map>::get(in_stack_00000168);
  *(enum_type *)&in_RDI[1]._M_gcount = eVar2;
  return;
}

Assistant:

void delete_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(name, i.codepage, i.header.lead_bytes);
	
	load_condition_data(is, i);
	
	load_version_data(is, i.version);
	
	type = stored_enum<delete_target_type_map>(is).get();
}